

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::CIrrDeviceSDL::SKeyMap>::sort(array<irr::CIrrDeviceSDL::SKeyMap> *this)

{
  if (this->is_sorted == false) {
    ::std::
    __sort<__gnu_cxx::__normal_iterator<irr::CIrrDeviceSDL::SKeyMap*,std::vector<irr::CIrrDeviceSDL::SKeyMap,std::allocator<irr::CIrrDeviceSDL::SKeyMap>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->m_data).
               super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->m_data).
               super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    this->is_sorted = true;
  }
  return;
}

Assistant:

void sort()
	{
		if (!is_sorted) {
			std::sort(m_data.begin(), m_data.end());
			is_sorted = true;
		}
	}